

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmInstructionType
anon_unknown.dwarf_12e14a::GetStoreInstruction(ExpressionContext *ctx,TypeBase *type)

{
  uint uVar1;
  ulong uVar2;
  VmInstructionType VVar3;
  
  VVar3 = VM_INST_STORE_BYTE;
  if ((ctx->typeBool != type) && (ctx->typeChar != type)) {
    if (ctx->typeShort == type) {
      VVar3 = VM_INST_STORE_SHORT;
    }
    else {
      VVar3 = VM_INST_STORE_INT;
      if (ctx->typeInt != type) {
        if (ctx->typeFloat == type) {
          VVar3 = VM_INST_STORE_FLOAT;
        }
        else if (ctx->typeDouble == type) {
          VVar3 = VM_INST_STORE_DOUBLE;
        }
        else {
          VVar3 = VM_INST_STORE_LONG;
          if (ctx->typeLong != type) {
            if (type == (TypeBase *)0x0) {
              if (ctx->typeAutoRef == (TypeStruct *)0x0) {
                return VM_INST_STORE_STRUCT;
              }
              if (ctx->typeAutoArray == (TypeStruct *)0x0) {
                return VM_INST_STORE_STRUCT;
              }
            }
            else {
              uVar1 = type->typeID;
              if (uVar1 == 0x12) {
                return VM_INST_STORE_LONG;
              }
              if (uVar1 == 0x15) {
                return VM_INST_STORE_STRUCT;
              }
              if (uVar1 == 0x19) {
                return VM_INST_STORE_INT;
              }
              if (uVar1 == 0x14) {
                return VM_INST_STORE_STRUCT;
              }
              if (ctx->typeAutoRef == (TypeStruct *)type) {
                return VM_INST_STORE_STRUCT;
              }
              if (ctx->typeAutoArray == (TypeStruct *)type) {
                return VM_INST_STORE_STRUCT;
              }
              if (uVar1 - 9 < 3) {
                return *(VmInstructionType *)(&DAT_00204388 + (ulong)(uVar1 - 9) * 4);
              }
            }
            VVar3 = VM_INST_STORE_STRUCT;
            uVar2 = type->size;
            if (uVar2 == 0) {
              __assert_fail("type->size != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1ba,
                            "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                           );
            }
            if ((uVar2 & 3) != 0) {
              __assert_fail("type->size % 4 == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1bb,
                            "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                           );
            }
            if (0xfffffff < (long)uVar2) {
              __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1bc,
                            "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                           );
            }
          }
        }
      }
    }
  }
  return VVar3;
}

Assistant:

VmInstructionType GetStoreInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_STORE_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_STORE_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_STORE_INT;

		if(type == ctx.typeFloat)
			return VM_INST_STORE_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_STORE_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_STORE_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_STORE_POINTER;

		if(isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeFunction>(type) || isType<TypeUnsizedArray>(type) || type == ctx.typeAutoRef || type == ctx.typeAutoArray)
			return VM_INST_STORE_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_STORE_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_STORE_STRUCT;
	}